

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O0

float trng::math::detail::GammaP_asympt<float>(float a,float x)

{
  float in_XMM0_Da;
  float fVar1;
  double dVar2;
  double dVar3;
  float in_XMM1_Da;
  float correction;
  float leading;
  float eta;
  float eta_squared_half;
  float mu;
  float in_stack_0000003c;
  float in_stack_00000040;
  float in_stack_00000044;
  float in_stack_fffffffffffffff0;
  
  fVar1 = mln1p<float>(in_stack_fffffffffffffff0);
  dVar2 = std::sqrt((double)(ulong)(uint)(fVar1 * 2.0));
  dVar2 = std::copysign(dVar2,(double)(ulong)(uint)((in_XMM1_Da - in_XMM0_Da) / in_XMM0_Da));
  dVar3 = std::sqrt((double)(ulong)(uint)(in_XMM0_Da / 2.0));
  dVar2 = std::erfc((double)(ulong)(uint)(-SUB84(dVar2,0) * SUB84(dVar3,0)));
  fVar1 = GammaPQ_asympt_R<float>(in_stack_00000044,in_stack_00000040,in_stack_0000003c);
  return SUB84(dVar2,0) / 2.0 + -fVar1;
}

Assistant:

TRNG_CUDA_ENABLE T GammaP_asympt(T a, T x) {
        const T mu{(x - a) / a};
        const T eta_squared_half{mln1p(mu)};
        const T eta{copysign(sqrt(2 * eta_squared_half), mu)};
        const T leading{erfc(-eta * sqrt(a / 2)) / 2};
        const T correction{-GammaPQ_asympt_R(a, eta, eta_squared_half)};
        return leading + correction;
      }